

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O1

void __thiscall polyscope::SlicePlane::setSliceGeomUniforms(SlicePlane *this,ShaderProgram *p)

{
  mat<4,_4,_float,_(glm::qualifier)0> *pmVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if ((this->active).value == true) {
    pmVar1 = &(this->objectTransform).value;
    fVar5 = pmVar1->value[0].field_0.x;
    fVar6 = (this->objectTransform).value.value[0].field_1.y;
    fVar7 = *(float *)&pmVar1->value[0].field_1;
    auVar10._0_4_ = fVar5 * fVar5;
    auVar10._4_4_ = fVar6 * fVar6;
    auVar10._8_8_ = 0;
    auVar10 = vhaddps_avx(auVar10,auVar10);
    fVar9 = (this->objectTransform).value.value[0].field_2.z;
    fVar8 = auVar10._0_4_ + fVar9 * fVar9;
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
    }
    else {
      auVar10 = vsqrtss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
      fVar8 = auVar10._0_4_;
      fVar7 = fVar6;
    }
    fVar8 = 1.0 / fVar8;
    local_78._4_4_ = fVar7 * fVar8;
    local_78._0_4_ = fVar5 * fVar8;
    fStack_70 = fVar8 * 0.0;
    fStack_6c = fVar8 * 0.0;
    fVar9 = fVar9 * fVar8;
  }
  else {
    _local_78 = SUB6416(ZEXT464(0xbf800000),0);
    fVar9 = 0.0;
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"u_sliceVector","");
  (*p->_vptr_ShaderProgram[9])(local_78,(ulong)(uint)fVar9,p,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"u_slicePoint","");
  bVar4 = (this->active).value;
  if (bVar4 == false) {
    auVar11 = SUB6416(ZEXT464(0x7f800000),0);
  }
  else {
    uVar2 = (this->objectTransform).value.value[3].field_0;
    uVar3 = (this->objectTransform).value.value[3].field_1;
    auVar11._4_4_ = uVar3;
    auVar11._0_4_ = uVar2;
    auVar11._8_8_ = 0;
  }
  auVar12._0_4_ = local_78._0_4_ * auVar11._0_4_;
  auVar12._4_4_ = local_78._4_4_ * auVar11._4_4_;
  auVar12._8_4_ = local_78._8_4_ * auVar11._8_4_;
  auVar12._12_4_ = local_78._12_4_ * auVar11._12_4_;
  auVar10 = vhaddps_avx(auVar12,auVar12);
  (*p->_vptr_ShaderProgram[5])
            ((ulong)(uint)(fVar9 * (uint)(bVar4 & 1) *
                                   (this->objectTransform).value.value[3].field_2 + auVar10._0_4_),p
             ,(string *)local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  return;
}

Assistant:

void SlicePlane::setSliceGeomUniforms(render::ShaderProgram& p) {
  glm::vec3 norm = getNormal();
  p.setUniform("u_sliceVector", norm);
  p.setUniform("u_slicePoint", glm::dot(getCenter(), norm));
}